

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O0

void __thiscall
klogic::mlmvn::load_neurons
          (mlmvn *this,cvector *all_weights,vector<int,_std::allocator<int>_> *k_values)

{
  bool bVar1;
  size_type sVar2;
  runtime_error *this_00;
  size_t sVar3;
  reference this_01;
  reference pvVar4;
  cvector *pcVar5;
  reference piVar6;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_b8;
  complex<double> *local_b0;
  complex<double> *local_a8;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_a0;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_98;
  undefined1 local_90 [8];
  mvn neuron;
  size_t w;
  int k;
  vector<klogic::mvn,_std::allocator<klogic::mvn>_> *layer_neurons;
  const_iterator cStack_50;
  int layer;
  const_iterator it_k;
  const_iterator it_w;
  size_type local_30;
  size_t n_neurons;
  size_t n_weights;
  vector<int,_std::allocator<int>_> *k_values_local;
  cvector *all_weights_local;
  mlmvn *this_local;
  
  n_weights = (size_t)k_values;
  k_values_local = (vector<int,_std::allocator<int>_> *)all_weights;
  all_weights_local = (cvector *)this;
  get_stats(this,&n_neurons,&local_30);
  sVar2 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                    ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                     k_values_local);
  if (sVar2 == n_neurons) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)n_weights);
    if (sVar2 == local_30) {
      it_k._M_current =
           (int *)std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *
                             )k_values_local);
      cStack_50 = std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)n_weights);
      layer_neurons._4_4_ = 0;
      while( true ) {
        sVar3 = layers_count(this);
        if (sVar3 <= (ulong)(long)layer_neurons._4_4_) break;
        this_01 = std::
                  vector<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                  ::operator[](&this->neurons,(long)layer_neurons._4_4_);
        w._4_4_ = 0;
        while( true ) {
          sVar2 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::size(this_01);
          if (sVar2 <= (ulong)(long)w._4_4_) break;
          pvVar4 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::operator[]
                             (this_01,(long)w._4_4_);
          pcVar5 = mvn::weights_vector(pvVar4);
          neuron._24_8_ =
               std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                         (pcVar5);
          piVar6 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&stack0xffffffffffffffb0);
          mvn::mvn((mvn *)local_90,*piVar6,neuron.k + -1);
          local_98._M_current = (complex<double> *)it_k._M_current;
          local_a0 = __gnu_cxx::
                     __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                     ::operator+((__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                                  *)&it_k,neuron._24_8_);
          pcVar5 = mvn::weights_vector((mvn *)local_90);
          local_a8 = (complex<double> *)
                     std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                     begin(pcVar5);
          local_b0 = (complex<double> *)
                     std::
                     copy<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>
                               (local_98,local_a0,
                                (__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                                 )local_a8);
          pvVar4 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::operator[]
                             (this_01,(long)w._4_4_);
          mvn::operator=(pvVar4,(mvn *)local_90);
          __gnu_cxx::
          __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
          ::operator+=((__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                        *)&it_k,neuron._24_8_);
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&stack0xffffffffffffffb0);
          mvn::~mvn((mvn *)local_90);
          w._4_4_ = w._4_4_ + 1;
        }
        layer_neurons._4_4_ = layer_neurons._4_4_ + 1;
      }
      local_b8._M_current =
           (complex<double> *)
           std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                     ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                      k_values_local);
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                          *)&it_k,&local_b8);
      if (!bVar1) {
        __assert_fail("it_w == all_weights.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc"
                      ,0xd9,
                      "void klogic::mlmvn::load_neurons(const klogic::cvector &, const std::vector<int> &)"
                     );
      }
      local_c0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)n_weights);
      bVar1 = __gnu_cxx::operator==(&stack0xffffffffffffffb0,&local_c0);
      if (!bVar1) {
        __assert_fail("it_k == k_values.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc"
                      ,0xda,
                      "void klogic::mlmvn::load_neurons(const klogic::cvector &, const std::vector<int> &)"
                     );
      }
      return;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"klogic::mlmvn::load_neurons(): size mismatch");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void klogic::mlmvn::load_neurons(const klogic::cvector &all_weights, const std::vector<int> &k_values)
{
    size_t n_weights, n_neurons;

    get_stats(n_weights, n_neurons);

    if (all_weights.size() != n_weights || k_values.size() != n_neurons)
        throw std::runtime_error("klogic::mlmvn::load_neurons(): size mismatch");

    klogic::cvector::const_iterator  it_w = all_weights.begin();
    std::vector<int>::const_iterator it_k = k_values.begin();

    for (int layer = 0; layer < layers_count(); ++layer) {
        vector<mvn> &layer_neurons = neurons[layer];

        for (int k = 0; k < layer_neurons.size(); ++k) {
            // Neuron [(k+1), (layer+1)]
            size_t w = layer_neurons[k].weights_vector().size();
            mvn neuron(*it_k, w - 1);

            copy(it_w, it_w + w, neuron.weights_vector().begin());

            layer_neurons[k] = neuron;

            it_w += w;
            ++it_k;
        }
    }

    assert(it_w == all_weights.end());
    assert(it_k == k_values.end());
}